

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_putfield(ExecutionEngine *this)

{
  byte bVar1;
  u2 index;
  cp_info *constantPool;
  int iVar2;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar3;
  u1 *puVar4;
  ulong uVar5;
  char *pcVar6;
  anon_union_8_10_52016fac_for_data this_02;
  ulong uVar7;
  undefined8 uVar8;
  Value VVar9;
  Value VVar10;
  string fieldName;
  string fieldDescriptor;
  string className;
  allocator local_b1;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  byte *local_70 [2];
  byte local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  ppcVar3 = Frame::getConstantPool(this_01);
  constantPool = *ppcVar3;
  puVar4 = Frame::getCode(this_01,this_01->pc);
  uVar5 = (ulong)(ushort)(*(ushort *)(puVar4 + 1) << 8 | *(ushort *)(puVar4 + 1) >> 8);
  if (constantPool[uVar5 - 1].tag != '\t') {
    __assert_fail("fieldCP.tag == CONSTANT_Fieldref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xeb8,"void ExecutionEngine::i_putfield()");
  }
  uVar7 = (ulong)constantPool[uVar5 - 1].info.fieldref_info.name_and_type_index;
  pcVar6 = getFormattedConstant(constantPool,constantPool[uVar5 - 1].info.fieldref_info.class_index)
  ;
  std::__cxx11::string::string((string *)local_50,pcVar6,(allocator *)&local_b0);
  if (constantPool[uVar7 - 1].tag == '\f') {
    index = constantPool[uVar7 - 1].info.fieldref_info.name_and_type_index;
    pcVar6 = getFormattedConstant
                       (constantPool,constantPool[uVar7 - 1].info.fieldref_info.class_index);
    std::__cxx11::string::string((string *)&local_b0,pcVar6,(allocator *)local_70);
    pcVar6 = getFormattedConstant(constantPool,index);
    std::__cxx11::string::string((string *)local_70,pcVar6,&local_b1);
    VVar9 = Frame::popTopOfOperandStack(this_01);
    uVar8 = VVar9._0_8_;
    if (VVar9.type >> 1 == 3) {
      Frame::popTopOfOperandStack(this_01);
    }
    else {
      bVar1 = *local_70[0];
      if (bVar1 < 0x53) {
        if (bVar1 == 0x42) {
          uVar8 = 0x100000001;
        }
        else if (bVar1 == 0x43) {
          uVar8 = 0x200000002;
        }
      }
      else if (bVar1 == 0x53) {
        uVar8 = 0x300000003;
      }
      else if (bVar1 == 0x5a) {
        uVar8 = 0;
      }
    }
    VVar10 = Frame::popTopOfOperandStack(this_01);
    this_02 = VVar10.data;
    if (VVar10.type == REFERENCE) {
      iVar2 = (**((Object *)&(this_02.object)->_vptr_Object)->_vptr_Object)(this_02.longValue);
      if (iVar2 == 0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_b0 + local_a8);
        VVar9.printType = (int)uVar8;
        VVar9.type = (int)((ulong)uVar8 >> 0x20);
        ClassInstance::putValueIntoField((ClassInstance *)this_02.object,VVar9,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        this_01->pc = this_01->pc + 3;
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        return;
      }
      __assert_fail("object->objectType() == ObjectType::CLASS_INSTANCE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0xee1,"void ExecutionEngine::i_putfield()");
    }
    __assert_fail("objectValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xedf,"void ExecutionEngine::i_putfield()");
  }
  __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xebf,"void ExecutionEngine::i_putfield()");
}

Assistant:

void ExecutionEngine::i_putfield() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t fieldIndex = (byte1 << 8) | byte2;
    cp_info fieldCP = constantPool[fieldIndex-1];
    assert(fieldCP.tag == CONSTANT_Fieldref); // precisa ser um fieldRef

    CONSTANT_Fieldref_info fieldRef = fieldCP.info.fieldref_info;

    string className = getFormattedConstant(constantPool, fieldRef.class_index);

    cp_info nameAndTypeCP = constantPool[fieldRef.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info fieldNameAndType = nameAndTypeCP.info.nameAndType_info;

    string fieldName = getFormattedConstant(constantPool, fieldNameAndType.name_index);
    string fieldDescriptor = getFormattedConstant(constantPool, fieldNameAndType.descriptor_index);

    Value valueToBeInserted = topFrame->popTopOfOperandStack();
    if (valueToBeInserted.type == ValueType::DOUBLE || valueToBeInserted.type == ValueType::LONG) {
        topFrame->popTopOfOperandStack(); // removendo padding
    } else {
        switch (fieldDescriptor[0]) {
            case 'B':
                valueToBeInserted.type = ValueType::BYTE;
                valueToBeInserted.printType = ValueType::BYTE;
                break;
            case 'C':
                valueToBeInserted.type = ValueType::CHAR;
                valueToBeInserted.printType = ValueType::CHAR;
                break;
            case 'S':
                valueToBeInserted.type = ValueType::SHORT;
                valueToBeInserted.printType = ValueType::SHORT;
                break;
            case 'Z':
                valueToBeInserted.type = ValueType::BOOLEAN;
                valueToBeInserted.printType = ValueType::BOOLEAN;
                break;
        }
    }

    Value objectValue = topFrame->popTopOfOperandStack();
    assert(objectValue.type == ValueType::REFERENCE);
    Object *object = objectValue.data.object;
    assert(object->objectType() == ObjectType::CLASS_INSTANCE);
    ClassInstance *classInstance = (ClassInstance *) object;

    classInstance->putValueIntoField(valueToBeInserted, fieldName);

    topFrame->pc += 3;
}